

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.hpp
# Opt level: O0

iterator __thiscall
first_fit_heap<32UL>::free_list_container::first_free
          (free_list_container *this,size_t size,iterator *before)

{
  bool bVar1;
  iterator local_58;
  header_free *local_50;
  header_free *elem;
  iterator __end0;
  iterator __begin0;
  free_list_container *__range2;
  iterator before_;
  iterator *before_local;
  size_t size_local;
  free_list_container *this_local;
  
  __range2 = (free_list_container *)end(this);
  __end0 = begin(this);
  elem = (header_free *)end(this);
  while( true ) {
    bVar1 = iterator::operator!=(&__end0,(iterator *)&elem);
    if (!bVar1) {
      iterator::iterator((iterator *)&this_local,(header_free *)0x0);
      return (iterator)(header_free *)this_local;
    }
    local_50 = iterator::operator*(&__end0);
    bVar1 = fits(this,local_50,size);
    if (bVar1) break;
    iterator::iterator(&local_58,local_50);
    __range2 = (free_list_container *)local_58.block;
    iterator::operator++(&__end0);
  }
  before->block = (header_free *)__range2;
  iterator::iterator((iterator *)&this_local,local_50);
  return (iterator)(header_free *)this_local;
}

Assistant:

iterator first_free(size_t size, iterator &before) const
        {
            iterator before_ = end();

            for (auto elem : *this) {
                if (fits(*elem, size)) {
                    before = before_;
                    return {elem};
                }
                before_ = iterator(elem);
            }

            return {};
        }